

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::clear(Builder *this)

{
  uchar *puVar1;
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x20) = 0;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::clear((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           *)0x10fee4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10fef5);
  if (*(long *)(in_RDI + 0x10) != 0) {
    Buffer<unsigned_char>::reset((Buffer<unsigned_char> *)0x10ff0f);
    puVar1 = Buffer<unsigned_char>::data(*(Buffer<unsigned_char> **)(in_RDI + 0x10));
    *(uchar **)(in_RDI + 0x18) = puVar1;
  }
  *(undefined1 *)(in_RDI + 0xa8) = 0;
  return;
}

Assistant:

void clear() noexcept {
    _pos = 0;
    _stack.clear();
    _indexes.clear();
    if (_bufferPtr != nullptr) {
      _bufferPtr->reset();
      _start = _bufferPtr->data();
    }
    _keyWritten = false;
  }